

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::CalcStrainANSbilinearShell(ChElementShellANCF_3423 *this)

{
  double *pdVar1;
  undefined8 uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  Matrix<double,_1,_8,_1,_1,_8> *pMVar34;
  ChMatrixNM<double,_8,_24> *pCVar35;
  int i;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar42 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ChMatrixNM<double,_1,_8> Nz;
  ChMatrixNM<double,_1,_3> tmpZ;
  LhsNested actual_lhs_1;
  LhsNested actual_lhs;
  Matrix<double,_1,_8,_1,_1,_8> local_280;
  undefined8 *local_218;
  Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> local_210;
  undefined8 uStack_208;
  double dStack_200;
  Scalar local_1f0;
  ChElementShellANCF_3423 *local_1e8;
  ChMatrixNM<double,_8,_8> *local_1e0;
  ChMatrixNM<double,_8,_8> *local_1d8;
  long local_1d0;
  ChMatrixNM<double,_8,_24> *local_1c8;
  undefined1 local_1c0 [40];
  double dStack_198;
  double dStack_190;
  double dStack_188;
  undefined1 local_180 [40];
  double dStack_158;
  double dStack_150;
  double dStack_148;
  Matrix<double,_8,_1,_0,_8,_1> local_140;
  double local_d0;
  undefined8 uStack_c8;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  
  local_218 = (undefined8 *)::operator_new(0xc0);
  pCVar35 = &this->m_strainANS_D;
  lVar36 = 0;
  *local_218 = 0xbff0000000000000;
  local_218[1] = 0xbff0000000000000;
  local_218[2] = 0;
  local_218[3] = 0x3ff0000000000000;
  local_218[4] = 0xbff0000000000000;
  local_218[5] = 0;
  local_218[6] = 0xbff0000000000000;
  local_218[7] = 0x3ff0000000000000;
  local_d0 = 1.0;
  uStack_c8 = 0x3ff0000000000000;
  local_218[8] = 0;
  local_218[9] = 0x3ff0000000000000;
  local_218[10] = 0x3ff0000000000000;
  local_218[0xb] = 0;
  local_218[0xc] = 0xbff0000000000000;
  local_218[0xd] = 0;
  local_218[0xe] = 0;
  local_218[0xf] = 0x3ff0000000000000;
  local_218[0x10] = 0;
  local_218[0x11] = 0;
  local_218[0x12] = 0;
  local_218[0x13] = 0xbff0000000000000;
  local_218[0x14] = 0;
  local_218[0x15] = 0;
  local_218[0x16] = 0x3ff0000000000000;
  local_218[0x17] = 0;
  local_1d8 = &this->m_ddT;
  local_1e0 = &this->m_d0d0T;
  local_1e8 = this;
  do {
    auVar71._8_8_ = 0x3fd0000000000000;
    auVar71._0_8_ = 0x3fd0000000000000;
    auVar39._8_8_ = local_1e8->m_lenX;
    auVar39._0_8_ = local_1e8->m_lenX;
    auVar37 = vdivpd_avx512vl(_DAT_009aa830,auVar39);
    dVar12 = (double)local_218[lVar36 * 3 + 2] * local_1e8->m_thickness * 0.5 * 0.25;
    auVar43 = vpermpd_avx2(ZEXT1632(auVar37),0x50);
    auVar40._8_8_ = dVar12;
    auVar40._0_8_ = dVar12;
    auVar37 = vunpcklpd_avx(auVar71,auVar40);
    auVar42 = vblendpd_avx(ZEXT1632(auVar37),_DAT_009aa720,0xc);
    auVar42 = vpermpd_avx2(auVar42,100);
    auVar59 = ZEXT3264(CONCAT824(auVar43._24_8_ * auVar42._24_8_,
                                 CONCAT816(auVar43._16_8_ * auVar42._16_8_,
                                           CONCAT88(auVar43._8_8_ * auVar42._8_8_,
                                                    auVar43._0_8_ * auVar42._0_8_))));
    auVar59 = vshuff64x2_avx512f(auVar59,auVar59,0x14);
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
         = 1.0 - (double)local_218[lVar36 * 3 + 1];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
         = (double)local_218[lVar36 * 3 + 1] + local_d0;
    auVar52 = vpermt2pd_avx512f(_DAT_009aad40,
                                ZEXT1664(CONCAT88(local_280.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                                                  .m_storage.m_data.array[7],
                                                  local_280.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                                                  .m_storage.m_data.array[7])));
    _local_180 = vmulpd_avx512f(auVar52,auVar59);
    auVar37._0_8_ = local_1e8->m_lenY;
    auVar37._8_8_ = local_1e8->m_thickness;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
         = 0.0;
    local_1f0 = 1.0;
    dVar13 = 1.0 - (double)local_218[lVar36 * 3];
    dVar11 = (double)local_218[lVar36 * 3] + local_d0;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar13;
    auVar39 = vunpcklpd_avx(auVar37,auVar64);
    auVar42._8_8_ = dVar11;
    auVar42._0_8_ = auVar37._0_8_;
    auVar42._16_16_ = auVar39;
    vdivpd_avx(_DAT_009aa740,auVar42);
    auVar41._0_8_ = (double)auVar37._0_8_ * 0.25;
    auVar41._8_8_ = dVar11 * 0.25;
    auVar43._16_8_ = auVar39._0_8_ * 0.25;
    auVar43._0_16_ = auVar41;
    auVar43._24_8_ = auVar39._8_8_ * 0.25;
    auVar59 = vpermt2pd_avx512f(_DAT_009aad80,ZEXT3264(auVar43));
    auVar52 = vpermt2pd_avx512f(_DAT_009aadc0,ZEXT1664(CONCAT88(dVar12 * dVar11,dVar12 * dVar13)));
    _local_1c0 = vmulpd_avx512f(auVar59,auVar52);
    auVar37 = vshufpd_avx(auVar41,auVar41,1);
    auVar39 = vshufpd_avx(auVar43._16_16_,auVar43._16_16_,1);
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[1]
         = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3] * auVar39._0_8_;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
         = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3] * auVar37._0_8_;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
         = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7] * auVar37._0_8_;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
         = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7] * auVar39._0_8_;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[2]
         = 0.0;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4]
         = 0.0;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6]
         = 0.0;
    local_210.m_matrix = &local_280;
    local_1d0 = lVar36;
    local_1c8 = pCVar35;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
              (local_1d8,&local_210,&local_140,&local_1f0);
    local_1f0 = 1.0;
    local_c0 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
               m_data.array[0];
    dStack_b8 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[1];
    dStack_b0 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[2];
    dStack_a8 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[3];
    dStack_a0 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[4];
    dStack_98 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[5];
    dStack_90 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[6];
    dStack_88 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                m_data.array[7];
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
         = 0.0;
    local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
         = 0.0;
    local_210.m_matrix = &local_280;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
              (local_1e0,&local_210,&local_140,&local_1f0);
    auVar59._8_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[1];
    auVar59._0_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[0];
    auVar59._16_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[2];
    auVar59._24_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[3];
    auVar59._32_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[4];
    auVar59._40_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[5];
    auVar59._48_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[6];
    auVar59._56_8_ =
         local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[7];
    if ((0xfU >> ((uint)local_1d0 & 0x1f) & 1) == 0) {
      if ((0x30U >> ((uint)local_1d0 & 0x1f) & 1) == 0) {
        auVar67._8_8_ = local_180._32_8_;
        auVar67._0_8_ = local_180._32_8_;
        auVar70._8_8_ = dStack_158;
        auVar70._0_8_ = dStack_158;
        auVar74._8_8_ = dStack_150;
        auVar74._0_8_ = dStack_150;
        auVar77._8_8_ = dStack_148;
        auVar77._0_8_ = dStack_148;
        auVar80._8_8_ = local_180._8_8_;
        auVar80._0_8_ = local_180._8_8_;
        auVar83._8_8_ = local_180._24_8_;
        auVar83._0_8_ = local_180._24_8_;
        lVar36 = 0;
        auVar52._8_8_ = dStack_b8;
        auVar52._0_8_ = local_c0;
        auVar52._16_8_ = dStack_b0;
        auVar52._24_8_ = dStack_a8;
        auVar52._32_8_ = dStack_a0;
        auVar52._40_8_ = dStack_98;
        auVar52._48_8_ = dStack_90;
        auVar52._56_8_ = dStack_88;
        auVar52 = vmulpd_avx512f(_local_180,auVar52);
        auVar59 = vmulpd_avx512f(auVar59,_local_180);
        auVar42 = vextractf64x4_avx512f(auVar52,1);
        auVar43 = vextractf64x4_avx512f(auVar59,1);
        auVar53 = vpermpd_avx512f(_local_180,0xed);
        auVar54 = vpermpd_avx512f(_local_180,0xe8);
        (local_1e8->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.
        m_storage.m_data.array[local_1d0] =
             (auVar52._0_8_ + auVar42._0_8_ + auVar52._8_8_ + auVar42._8_8_ +
             auVar52._16_8_ + auVar42._16_8_ + auVar52._24_8_ + auVar42._24_8_) -
             (auVar59._0_8_ + auVar43._0_8_ + auVar59._8_8_ + auVar43._8_8_ +
             auVar59._16_8_ + auVar43._16_8_ + auVar59._24_8_ + auVar43._24_8_);
        auVar37 = *(undefined1 (*) [16])
                   (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array;
        auVar39 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 3);
        auVar40 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 6);
        auVar41 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 9);
        auVar64 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 0xc);
        auVar71 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 0xf);
        auVar4 = *(undefined1 (*) [16])
                  ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array + 0x12);
        auVar5 = *(undefined1 (*) [16])
                  ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array + 0x15);
        auVar61._8_8_ = local_180._16_8_;
        auVar61._0_8_ = local_180._16_8_;
        auVar63._0_8_ = auVar37._0_8_ * (double)local_180._0_8_;
        auVar63._8_8_ = auVar37._8_8_ * (double)local_180._0_8_;
        auVar21._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0];
        auVar21._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0];
        auVar38 = vmulpd_avx512vl(auVar37,auVar21);
        auVar37 = vfmadd231pd_fma(auVar63,auVar39,auVar80);
        auVar22._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar22._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar39 = vfmadd231pd_avx512vl(auVar38,auVar39,auVar22);
        auVar37 = vfmadd231pd_fma(auVar37,auVar40,auVar61);
        auVar85._8_8_ = 0;
        auVar85._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[2];
        auVar89._8_8_ = 0;
        auVar89._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[8];
        auVar38 = vunpcklpd_avx512vl(auVar85,auVar89);
        auVar23._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar23._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar40,auVar23);
        auVar87._8_8_ = 0;
        auVar87._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[5];
        auVar91._8_8_ = 0;
        auVar91._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[0xb];
        auVar40 = vunpcklpd_avx512vl(auVar87,auVar91);
        auVar37 = vfmadd231pd_fma(auVar37,auVar41,auVar83);
        auVar24._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar24._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar41,auVar24);
        auVar37 = vfmadd231pd_fma(auVar37,auVar64,auVar67);
        auVar25._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar25._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar64,auVar25);
        auVar37 = vfmadd231pd_avx512vl(auVar37,auVar71,auVar70);
        auVar26._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar26._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar71,auVar26);
        auVar37 = vfmadd231pd_avx512vl(auVar37,auVar4,auVar74);
        auVar27._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar27._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar4,auVar27);
        auVar49._0_16_ = vfmadd231pd_avx512vl(auVar37,auVar5,auVar77);
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
        array[0] = auVar49._0_8_;
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
        array[1] = auVar49._8_8_;
        dVar11 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                 m_storage.m_data.array[0xe];
        dVar12 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                 m_storage.m_data.array[0x11];
        dVar13 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                 m_storage.m_data.array[0x14];
        dVar3 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                m_storage.m_data.array[0x17];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[3];
        auVar37 = vmulsd_avx512f(auVar91,auVar4);
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
        array[2] = auVar38._0_8_ * auVar54._0_8_ + auVar40._0_8_ * auVar53._0_8_ +
                   auVar38._8_8_ * auVar54._8_8_ + auVar40._8_8_ * auVar53._8_8_ +
                   (double)local_180._32_8_ * dVar11 + dVar12 * dStack_158 +
                   dVar3 * dStack_148 + dVar13 * dStack_150;
        auVar38._8_8_ = 0;
        auVar38._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar40 = vmulsd_avx512f(auVar87,auVar38);
        auVar58._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar58._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar50._0_16_ = vfmadd231pd_avx512vl(auVar39,auVar58,auVar5);
        local_210.m_matrix = auVar50._0_8_;
        uStack_208 = auVar50._8_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[0];
        auVar39 = vmulsd_avx512f(auVar85,auVar5);
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar41 = vmulsd_avx512f(auVar89,auVar10);
        dStack_200 = auVar39._0_8_ + auVar40._0_8_ + auVar41._0_8_ + auVar37._0_8_ +
                     dVar11 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[4] +
                     dVar12 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[5] +
                     dVar13 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[6] +
                     dVar3 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                             m_storage.m_data.array[7];
        auVar49._16_8_ =
             local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data
             .array[2];
        auVar49._24_8_ = 0;
        auVar50._16_8_ = dStack_200;
        auVar50._24_8_ = 0;
        pCVar35 = local_1c8;
        do {
          uVar2 = *(undefined8 *)(local_180 + lVar36 * 8);
          auVar31._8_8_ = uVar2;
          auVar31._0_8_ = uVar2;
          auVar31._16_8_ = uVar2;
          auVar31._24_8_ = uVar2;
          auVar42 = vmulpd_avx512vl(auVar50,auVar31);
          dVar11 = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[lVar36];
          auVar32._8_8_ = dVar11;
          auVar32._0_8_ = dVar11;
          auVar32._16_8_ = dVar11;
          auVar32._24_8_ = dVar11;
          auVar42 = vfmadd231pd_avx512vl(auVar42,auVar49,auVar32);
          lVar36 = lVar36 + 1;
          auVar51._0_24_ = auVar42._0_24_;
          auVar51._24_8_ =
               (pCVar35->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
               m_data.array[3];
          *(undefined1 (*) [32])
           (pCVar35->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
           m_data.array = auVar51;
          pCVar35 = (ChMatrixNM<double,_8,_24> *)
                    ((pCVar35->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).
                     m_storage.m_data.array + 3);
        } while (lVar36 != 8);
      }
      else {
        auVar66._8_8_ = local_1c0._32_8_;
        auVar66._0_8_ = local_1c0._32_8_;
        auVar69._8_8_ = dStack_198;
        auVar69._0_8_ = dStack_198;
        auVar73._8_8_ = dStack_190;
        auVar73._0_8_ = dStack_190;
        auVar76._8_8_ = dStack_188;
        auVar76._0_8_ = dStack_188;
        auVar79._8_8_ = local_1c0._8_8_;
        auVar79._0_8_ = local_1c0._8_8_;
        auVar82._8_8_ = local_1c0._24_8_;
        auVar82._0_8_ = local_1c0._24_8_;
        lVar36 = 0;
        auVar53._8_8_ = dStack_b8;
        auVar53._0_8_ = local_c0;
        auVar53._16_8_ = dStack_b0;
        auVar53._24_8_ = dStack_a8;
        auVar53._32_8_ = dStack_a0;
        auVar53._40_8_ = dStack_98;
        auVar53._48_8_ = dStack_90;
        auVar53._56_8_ = dStack_88;
        auVar52 = vmulpd_avx512f(_local_1c0,auVar53);
        auVar59 = vmulpd_avx512f(auVar59,_local_1c0);
        auVar42 = vextractf64x4_avx512f(auVar52,1);
        auVar43 = vextractf64x4_avx512f(auVar59,1);
        auVar53 = vpermpd_avx512f(_local_1c0,0xed);
        auVar54 = vpermpd_avx512f(_local_1c0,0xe8);
        (local_1e8->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.
        m_storage.m_data.array[local_1d0] =
             (auVar52._0_8_ + auVar42._0_8_ + auVar52._8_8_ + auVar42._8_8_ +
             auVar52._16_8_ + auVar42._16_8_ + auVar52._24_8_ + auVar42._24_8_) -
             (auVar59._0_8_ + auVar43._0_8_ + auVar59._8_8_ + auVar43._8_8_ +
             auVar59._16_8_ + auVar43._16_8_ + auVar59._24_8_ + auVar43._24_8_);
        auVar37 = *(undefined1 (*) [16])
                   (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array;
        auVar39 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 3);
        auVar40 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 6);
        auVar41 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 9);
        auVar64 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 0xc);
        auVar71 = *(undefined1 (*) [16])
                   ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                    m_storage.m_data.array + 0xf);
        auVar4 = *(undefined1 (*) [16])
                  ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array + 0x12);
        auVar5 = *(undefined1 (*) [16])
                  ((local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array + 0x15);
        auVar60._8_8_ = local_1c0._16_8_;
        auVar60._0_8_ = local_1c0._16_8_;
        auVar62._0_8_ = auVar37._0_8_ * (double)local_1c0._0_8_;
        auVar62._8_8_ = auVar37._8_8_ * (double)local_1c0._0_8_;
        auVar14._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0];
        auVar14._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[0];
        auVar38 = vmulpd_avx512vl(auVar37,auVar14);
        auVar37 = vfmadd231pd_fma(auVar62,auVar39,auVar79);
        auVar15._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar15._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[1];
        auVar39 = vfmadd231pd_avx512vl(auVar38,auVar39,auVar15);
        auVar37 = vfmadd231pd_fma(auVar37,auVar40,auVar60);
        auVar84._8_8_ = 0;
        auVar84._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[2];
        auVar88._8_8_ = 0;
        auVar88._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[8];
        auVar38 = vunpcklpd_avx512vl(auVar84,auVar88);
        auVar16._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar16._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[2];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar40,auVar16);
        auVar86._8_8_ = 0;
        auVar86._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[5];
        auVar90._8_8_ = 0;
        auVar90._0_8_ =
             (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
             .m_data.array[0xb];
        auVar40 = vunpcklpd_avx512vl(auVar86,auVar90);
        auVar37 = vfmadd231pd_fma(auVar37,auVar41,auVar82);
        auVar17._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar17._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[3];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar41,auVar17);
        auVar37 = vfmadd231pd_fma(auVar37,auVar64,auVar66);
        auVar18._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar18._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[4];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar64,auVar18);
        auVar37 = vfmadd231pd_avx512vl(auVar37,auVar71,auVar69);
        auVar19._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar19._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[5];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar71,auVar19);
        auVar37 = vfmadd231pd_avx512vl(auVar37,auVar4,auVar73);
        auVar20._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar20._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[6];
        auVar39 = vfmadd231pd_avx512vl(auVar39,auVar4,auVar20);
        auVar46._0_16_ = vfmadd231pd_avx512vl(auVar37,auVar5,auVar76);
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
        array[0] = auVar46._0_8_;
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
        array[1] = auVar46._8_8_;
        dVar11 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                 m_storage.m_data.array[0xe];
        dVar12 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                 m_storage.m_data.array[0x11];
        dVar13 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                 m_storage.m_data.array[0x14];
        dVar3 = (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                m_storage.m_data.array[0x17];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[3];
        auVar37 = vmulsd_avx512f(auVar90,auVar6);
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
        array[2] = auVar38._0_8_ * auVar54._0_8_ + auVar40._0_8_ * auVar53._0_8_ +
                   auVar38._8_8_ * auVar54._8_8_ + auVar40._8_8_ * auVar53._8_8_ +
                   (double)local_1c0._32_8_ * dVar11 + dVar12 * dStack_198 +
                   dVar3 * dStack_188 + dVar13 * dStack_190;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[1];
        auVar40 = vmulsd_avx512f(auVar86,auVar7);
        auVar57._8_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar57._0_8_ =
             local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array[7];
        auVar47._0_16_ = vfmadd231pd_avx512vl(auVar39,auVar57,auVar5);
        local_210.m_matrix = auVar47._0_8_;
        uStack_208 = auVar47._8_8_;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[0];
        auVar39 = vmulsd_avx512f(auVar84,auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                       m_storage.m_data.array[2];
        auVar41 = vmulsd_avx512f(auVar88,auVar9);
        dStack_200 = auVar39._0_8_ + auVar40._0_8_ + auVar41._0_8_ + auVar37._0_8_ +
                     dVar11 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[4] +
                     dVar12 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[5] +
                     dVar13 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>
                              .m_storage.m_data.array[6] +
                     dVar3 * local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                             m_storage.m_data.array[7];
        auVar46._16_8_ =
             local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data
             .array[2];
        auVar46._24_8_ = 0;
        auVar47._16_8_ = dStack_200;
        auVar47._24_8_ = 0;
        pCVar35 = local_1c8;
        do {
          uVar2 = *(undefined8 *)(local_1c0 + lVar36 * 8);
          auVar29._8_8_ = uVar2;
          auVar29._0_8_ = uVar2;
          auVar29._16_8_ = uVar2;
          auVar29._24_8_ = uVar2;
          auVar42 = vmulpd_avx512vl(auVar47,auVar29);
          dVar11 = local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                   m_data.array[lVar36];
          auVar30._8_8_ = dVar11;
          auVar30._0_8_ = dVar11;
          auVar30._16_8_ = dVar11;
          auVar30._24_8_ = dVar11;
          auVar42 = vfmadd231pd_avx512vl(auVar42,auVar46,auVar30);
          lVar36 = lVar36 + 1;
          auVar48._0_24_ = auVar42._0_24_;
          auVar48._24_8_ =
               (pCVar35->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
               m_data.array[3];
          *(undefined1 (*) [32])
           (pCVar35->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.
           m_data.array = auVar48;
          pCVar35 = (ChMatrixNM<double,_8,_24> *)
                    ((pCVar35->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).
                     m_storage.m_data.array + 3);
        } while (lVar36 != 8);
      }
    }
    else {
      auVar54._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
      auVar54._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0];
      auVar54._16_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[2];
      auVar54._24_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
      auVar54._32_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[4];
      auVar54._40_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5];
      auVar54._48_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[6];
      auVar54._56_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
      auVar65._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[4];
      auVar65._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[4];
      auVar68._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5];
      auVar68._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5];
      auVar72._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[6];
      auVar72._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[6];
      auVar75._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
      auVar75._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
      auVar78._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
      auVar78._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
      auVar81._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
      auVar81._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
      lVar36 = 0;
      auVar33._8_8_ = dStack_b8;
      auVar33._0_8_ = local_c0;
      auVar33._16_8_ = dStack_b0;
      auVar33._24_8_ = dStack_a8;
      auVar33._32_8_ = dStack_a0;
      auVar33._40_8_ = dStack_98;
      auVar33._48_8_ = dStack_90;
      auVar33._56_8_ = dStack_88;
      auVar52 = vmulpd_avx512f(auVar54,auVar33);
      auVar59 = vmulpd_avx512f(auVar59,auVar54);
      auVar53 = vpermpd_avx512f(auVar54,0xe8);
      auVar42 = vextractf64x4_avx512f(auVar52,1);
      auVar54 = vpermpd_avx512f(auVar54,0xed);
      auVar43 = vextractf64x4_avx512f(auVar59,1);
      auVar56._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[2];
      auVar56._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[2];
      (local_1e8->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.
      m_storage.m_data.array[local_1d0] =
           ((auVar52._0_8_ + auVar42._0_8_ + auVar52._8_8_ + auVar42._8_8_ +
            auVar52._16_8_ + auVar42._16_8_ + auVar52._24_8_ + auVar42._24_8_) -
           (auVar59._0_8_ + auVar43._0_8_ + auVar59._8_8_ + auVar43._8_8_ +
           auVar59._16_8_ + auVar43._16_8_ + auVar59._24_8_ + auVar43._24_8_)) * 0.5;
      auVar55._0_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0] *
           (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0];
      auVar55._8_8_ =
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0] *
           (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[1];
      auVar37 = vfmadd231pd_fma(auVar55,auVar78,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 3));
      auVar40 = vfmadd231pd_fma(auVar37,auVar56,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 6));
      auVar37 = vmovhpd_avx(*(undefined1 (*) [16])
                             ((local_1e8->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 2),
                            (local_1e8->m_d).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array[8]);
      auVar39 = vmovhpd_avx(*(undefined1 (*) [16])
                             ((local_1e8->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 5),
                            (local_1e8->m_d).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array[0xb]);
      auVar40 = vfmadd231pd_fma(auVar40,auVar81,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 9));
      auVar40 = vfmadd231pd_fma(auVar40,auVar65,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 0xc));
      auVar40 = vfmadd231pd_fma(auVar40,auVar68,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 0xf));
      auVar40 = vfmadd231pd_fma(auVar40,auVar72,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 0x12));
      auVar40 = vfmadd231pd_fma(auVar40,auVar75,
                                *(undefined1 (*) [16])
                                 ((local_1e8->m_d).
                                  super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                  m_storage.m_data.array + 0x15));
      local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
      [0] = auVar40._0_8_;
      local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
      [1] = auVar40._8_8_;
      local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
      [2] = auVar37._0_8_ * auVar53._0_8_ + auVar39._0_8_ * auVar54._0_8_ +
            auVar37._8_8_ * auVar53._8_8_ + auVar39._8_8_ * auVar54._8_8_ +
            local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
            array[4] *
            (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
            m_data.array[0xe] +
            local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
            array[5] *
            (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
            m_data.array[0x11] +
            local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
            array[6] *
            (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
            m_data.array[0x14] +
            local_280.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
            array[7] *
            (local_1e8->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
            m_data.array[0x17];
      auVar44._16_8_ =
           local_140.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
           array[2];
      auVar44._0_16_ = auVar40;
      auVar44._24_8_ = 0;
      pMVar34 = &local_280;
      do {
        uVar2 = *(undefined8 *)pMVar34;
        auVar28._8_8_ = uVar2;
        auVar28._0_8_ = uVar2;
        auVar28._16_8_ = uVar2;
        auVar28._24_8_ = uVar2;
        auVar42 = vmulpd_avx512vl(auVar44,auVar28);
        pMVar34 = (Matrix<double,_1,_8,_1,_1,_8> *)((long)pMVar34 + 8);
        pdVar1 = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).
                 m_storage.m_data.array + lVar36;
        auVar45._0_24_ = auVar42._0_24_;
        auVar45._24_8_ = pdVar1[3];
        *(undefined1 (*) [32])pdVar1 = auVar45;
        lVar36 = lVar36 + 3;
      } while (lVar36 != 0x18);
    }
    lVar36 = local_1d0 + 1;
    pCVar35 = (ChMatrixNM<double,_8,_24> *)
              ((local_1c8->super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage
               .m_data.array + 0x18);
  } while (lVar36 != 8);
  operator_delete(local_218,0xc0);
  return;
}

Assistant:

void ChElementShellANCF_3423::CalcStrainANSbilinearShell() {
    std::vector<ChVector<>> knots(8);

    knots[0] = ChVector<>(-1, -1, 0);
    knots[1] = ChVector<>(1, -1, 0);
    knots[2] = ChVector<>(-1, 1, 0);
    knots[3] = ChVector<>(1, 1, 0);
    knots[4] = ChVector<>(-1, 0, 0);  // A
    knots[5] = ChVector<>(1, 0, 0);   // B
    knots[6] = ChVector<>(0, -1, 0);  // C
    knots[7] = ChVector<>(0, 1, 0);   // D

    ChMatrixNM<double, 1, 8> Nx;
    ChMatrixNM<double, 1, 8> Ny;
    ChMatrixNM<double, 1, 8> Nz;
    ChVectorN<double, 8> ddNz;
    ChVectorN<double, 8> d0d0Nz;

    for (int kk = 0; kk < 8; kk++) {
        ShapeFunctionsDerivativeX(Nx, knots[kk].x(), knots[kk].y(), knots[kk].z());
        ShapeFunctionsDerivativeY(Ny, knots[kk].x(), knots[kk].y(), knots[kk].z());
        ShapeFunctionsDerivativeZ(Nz, knots[kk].x(), knots[kk].y(), knots[kk].z());

        ddNz = m_ddT * Nz.transpose();
        d0d0Nz = m_d0d0T * Nz.transpose();

        switch (kk) {
            case 0:
            case 1:
            case 2:
            case 3: {
                m_strainANS(kk) = 0.5 * ((Nz * ddNz)(0, 0) - (Nz * d0d0Nz)(0, 0));
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpZ(0, j) * Nz(0, i);
                break;
            }
            case 4:
            case 5: {  // => yz
                m_strainANS(kk) = (Ny * ddNz)(0, 0) - (Ny * d0d0Nz)(0, 0);
                ChMatrixNM<double, 1, 3> tmpY = Ny * m_d;
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpY(0, j) * Nz(0, i) + tmpZ(0, j) * Ny(0, i);
                break;
            }
            case 6:
            case 7: {  // => xz
                m_strainANS(kk) = (Nx * ddNz)(0, 0) - (Nx * d0d0Nz)(0, 0);
                ChMatrixNM<double, 1, 3> tmpX = Nx * m_d;
                ChMatrixNM<double, 1, 3> tmpZ = Nz * m_d;
                for (int i = 0; i < 8; i++)
                    for (int j = 0; j < 3; j++)
                        m_strainANS_D(kk, i * 3 + j) = tmpX(0, j) * Nz(0, i) + tmpZ(0, j) * Nx(0, i);
                break;
            }
        }
    }
}